

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_avx2_256_32.c
# Opt level: O1

parasail_result_t *
parasail_nw_table_diag_avx2_256_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int32_t iVar1;
  int iVar2;
  undefined4 uVar3;
  int *piVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int iVar19;
  int iVar20;
  parasail_result_t *ppVar21;
  undefined1 (*ptr) [16];
  int32_t *ptr_00;
  int32_t *ptr_01;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  int iVar41;
  int iVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  uint local_23c;
  int32_t *local_238;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  undefined1 local_158 [32];
  
  auVar57 = in_ZMM7._0_16_;
  if (_s2 == (char *)0x0) {
    parasail_nw_table_diag_avx2_256_32_cold_7();
  }
  else if (s2Len < 1) {
    parasail_nw_table_diag_avx2_256_32_cold_6();
  }
  else if (open < 0) {
    parasail_nw_table_diag_avx2_256_32_cold_5();
  }
  else if (gap < 0) {
    parasail_nw_table_diag_avx2_256_32_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_table_diag_avx2_256_32_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_nw_table_diag_avx2_256_32_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar46 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_nw_table_diag_avx2_256_32_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar46 = (ulong)(uint)matrix->length;
    }
    iVar26 = -open;
    iVar41 = matrix->min;
    uVar25 = 0x80000000 - iVar41;
    if (iVar41 != iVar26 && SBORROW4(iVar41,iVar26) == iVar41 + open < 0) {
      uVar25 = open | 0x80000000;
    }
    iVar41 = 0x7ffffffe - matrix->max;
    uVar23 = (uint)uVar46;
    ppVar21 = parasail_result_new_table1(uVar23,s2Len);
    if (ppVar21 != (parasail_result_t *)0x0) {
      ppVar21->flag = ppVar21->flag | 0x8421001;
      uVar44 = (ulong)(s2Len + 0xe);
      ptr = (undefined1 (*) [16])parasail_memalign_int32_t(0x20,uVar44);
      ptr_00 = parasail_memalign_int32_t(0x20,uVar44);
      ptr_01 = parasail_memalign_int32_t(0x20,uVar44);
      if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (undefined1 (*) [16])0x0))
      {
        if (matrix->type == 0) {
          iVar20 = uVar23 + 7;
          local_238 = parasail_memalign_int32_t(0x20,(long)iVar20);
          if (local_238 == (int32_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < (int)uVar23) {
            piVar4 = matrix->mapper;
            uVar44 = 0;
            do {
              local_238[uVar44] = piVar4[(byte)_s1[uVar44]];
              uVar44 = uVar44 + 1;
            } while (uVar46 != uVar44);
          }
          iVar42 = uVar23 + 1;
          if ((int)(uVar23 + 1) < iVar20) {
            iVar42 = iVar20;
          }
          memset(local_238 + (int)uVar23,0,(ulong)(~uVar23 + iVar42) * 4 + 4);
        }
        else {
          local_238 = (int32_t *)0x0;
        }
        uVar31 = s2Len + 7;
        auVar6 = vpinsrd_avx(ZEXT416((uint)-(gap * 3 + open)),iVar26 + gap * -2,1);
        auVar6 = vpinsrd_avx(auVar6,iVar26 - gap,2);
        uVar27 = uVar23 - 1;
        iVar20 = s2Len + -1;
        iVar42 = uVar25 + 1;
        auVar47._4_4_ = gap;
        auVar47._0_4_ = gap;
        auVar47._8_4_ = gap;
        auVar47._12_4_ = gap;
        auVar47._16_4_ = gap;
        auVar47._20_4_ = gap;
        auVar47._24_4_ = gap;
        auVar47._28_4_ = gap;
        auVar48 = vpslld_avx2(auVar47,3);
        auVar6 = vpinsrd_avx(auVar6,iVar26,3);
        auVar7 = vpinsrd_avx(ZEXT416((uint)(gap * -7 - open)),-(gap * 6 + open),1);
        auVar7 = vpinsrd_avx(auVar7,-(gap * 5 + open),2);
        auVar7 = vpinsrd_avx(auVar7,iVar26 + gap * -4,3);
        local_158._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar7;
        local_158._16_16_ = ZEXT116(1) * auVar6;
        piVar4 = matrix->mapper;
        uVar44 = 1;
        if (1 < s2Len) {
          uVar44 = (ulong)(uint)s2Len;
        }
        uVar24 = 0;
        do {
          *(int *)(ptr[1] + uVar24 * 4 + 0xc) = piVar4[(byte)_s2[uVar24]];
          uVar24 = uVar24 + 1;
        } while (uVar44 != uVar24);
        *(undefined1 (*) [16])(*ptr + 0xc) = (undefined1  [16])0x0;
        *ptr = (undefined1  [16])0x0;
        uVar24 = (ulong)(uint)s2Len;
        uVar25 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar31) {
          uVar25 = uVar31;
        }
        uVar45 = 0;
        auVar55 = ZEXT1632(auVar57);
        memset(ptr[1] + uVar24 * 4 + 0xc,0,(ulong)(~s2Len + uVar25) * 4 + 4);
        iVar19 = iVar26;
        do {
          ptr_00[uVar45 + 7] = iVar19;
          ptr_01[uVar45 + 7] = iVar42;
          uVar45 = uVar45 + 1;
          iVar19 = iVar19 - gap;
        } while (uVar44 != uVar45);
        lVar22 = 0;
        do {
          ptr_00[lVar22] = iVar42;
          ptr_01[lVar22] = iVar42;
          lVar22 = lVar22 + 1;
        } while (lVar22 != 7);
        lVar22 = uVar24 + 7;
        do {
          ptr_00[lVar22] = iVar42;
          ptr_01[lVar22] = iVar42;
          lVar22 = lVar22 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar31);
        ptr_00[6] = 0;
        if ((int)uVar23 < 1) {
          auVar55._4_4_ = iVar42;
          auVar55._0_4_ = iVar42;
          auVar55._8_4_ = iVar42;
          auVar55._12_4_ = iVar42;
          auVar55._16_4_ = iVar42;
          auVar55._20_4_ = iVar42;
          auVar55._24_4_ = iVar42;
          auVar55._28_4_ = iVar42;
          auVar52 = ZEXT3264(auVar55);
          auVar50._4_4_ = iVar41;
          auVar50._0_4_ = iVar41;
          auVar50._8_4_ = iVar41;
          auVar50._12_4_ = iVar41;
          auVar50._16_4_ = iVar41;
          auVar50._20_4_ = iVar41;
          auVar50._24_4_ = iVar41;
          auVar50._28_4_ = iVar41;
        }
        else {
          piVar4 = matrix->matrix;
          auVar13._4_4_ = iVar42;
          auVar13._0_4_ = iVar42;
          auVar13._8_4_ = iVar42;
          auVar13._12_4_ = iVar42;
          auVar13._16_4_ = iVar42;
          auVar13._20_4_ = iVar42;
          auVar13._24_4_ = iVar42;
          auVar13._28_4_ = iVar42;
          auVar49 = ZEXT3264(auVar13);
          auVar8 = vpalignr_avx2(ZEXT1632(auVar13._16_16_),auVar13,4);
          uVar44 = 1;
          if (1 < (int)uVar31) {
            uVar44 = (ulong)uVar31;
          }
          lVar22 = uVar24 * 0x20;
          local_1c8 = uVar24 * 4 + -4;
          local_1d8 = uVar24 * 0x1c + -0x1c;
          local_1e0 = uVar24 * 0x18 + -0x18;
          local_1e8 = uVar24 * 0x14 + -0x14;
          local_1f0 = uVar24 * 8 + -8;
          local_1f8 = uVar24 * 0x10 + -0x10;
          local_200 = uVar24 * 0xc + -0xc;
          auVar11 = vpmovsxbd_avx2(ZEXT816(0x1020304050607));
          local_1d0 = 0;
          auVar12 = vpmovsxbd_avx2(ZEXT816(0x7060504030201));
          auVar9 = vpcmpeqd_avx2(auVar55,auVar55);
          uVar45 = 0;
          auVar52 = ZEXT3264(auVar13);
          auVar51 = ZEXT3264(CONCAT428(iVar41,CONCAT424(iVar41,CONCAT420(iVar41,CONCAT416(iVar41,
                                                  CONCAT412(iVar41,CONCAT48(iVar41,CONCAT44(iVar41,
                                                  iVar41))))))));
          auVar18._4_4_ = open;
          auVar18._0_4_ = open;
          auVar18._8_4_ = open;
          auVar18._12_4_ = open;
          auVar18._16_4_ = open;
          auVar18._20_4_ = open;
          auVar18._24_4_ = open;
          auVar18._28_4_ = open;
          do {
            iVar19 = matrix->type;
            uVar23 = (uint)uVar45;
            uVar25 = uVar23;
            if (iVar19 == 0) {
              uVar25 = local_238[uVar45];
            }
            uVar30 = uVar45 | 1;
            if (iVar19 == 0) {
              uVar31 = local_238[uVar30];
            }
            else {
              uVar31 = uVar27;
              if (uVar30 < uVar46) {
                uVar31 = uVar23 | 1;
              }
            }
            uVar32 = uVar45 | 2;
            if (iVar19 == 0) {
              uVar35 = local_238[uVar32];
            }
            else {
              uVar35 = uVar27;
              if (uVar32 < uVar46) {
                uVar35 = uVar23 | 2;
              }
            }
            uVar36 = uVar45 | 3;
            if (iVar19 == 0) {
              uVar43 = local_238[uVar36];
            }
            else {
              uVar43 = uVar27;
              if (uVar36 < uVar46) {
                uVar43 = uVar23 | 3;
              }
            }
            uVar37 = uVar45 | 4;
            if (iVar19 == 0) {
              local_23c = local_238[uVar37];
            }
            else {
              local_23c = uVar27;
              if (uVar37 < uVar46) {
                local_23c = uVar23 | 4;
              }
            }
            uVar38 = uVar45 | 5;
            if (iVar19 == 0) {
              uVar29 = local_238[uVar38];
            }
            else {
              uVar29 = uVar27;
              if (uVar38 < uVar46) {
                uVar29 = uVar23 | 5;
              }
            }
            uVar33 = uVar45 | 6;
            if (iVar19 == 0) {
              uVar39 = local_238[uVar33];
            }
            else {
              uVar39 = uVar27;
              if (uVar33 < uVar46) {
                uVar39 = uVar23 | 6;
              }
            }
            iVar2 = matrix->size;
            uVar34 = uVar45 | 7;
            if (iVar19 == 0) {
              uVar28 = local_238[uVar34];
            }
            else {
              uVar28 = uVar27;
              if (uVar34 < uVar46) {
                uVar28 = uVar23 | 7;
              }
            }
            uVar45 = uVar45 + 8;
            iVar1 = ptr_00[6];
            auVar53._4_4_ = iVar1;
            auVar53._0_4_ = iVar1;
            auVar53._8_4_ = iVar1;
            auVar53._12_4_ = iVar1;
            auVar53._16_4_ = iVar1;
            auVar53._20_4_ = iVar1;
            auVar53._24_4_ = iVar1;
            auVar53._28_4_ = iVar1;
            ptr_00[6] = iVar26 - (int)uVar45 * gap;
            iVar19 = iVar26 - uVar23 * gap;
            auVar56._4_4_ = iVar19;
            auVar56._0_4_ = iVar19;
            auVar56._8_4_ = iVar19;
            auVar56._12_4_ = iVar19;
            auVar56._16_4_ = iVar19;
            auVar56._20_4_ = iVar19;
            auVar56._24_4_ = iVar19;
            auVar56._28_4_ = iVar19;
            auVar13 = vpblendd_avx2(auVar8,auVar56,0x80);
            auVar58 = vpblendd_avx2(auVar8,auVar53,0x80);
            auVar14._4_4_ = uVar27;
            auVar14._0_4_ = uVar27;
            auVar14._8_4_ = uVar27;
            auVar14._12_4_ = uVar27;
            auVar14._16_4_ = uVar27;
            auVar14._20_4_ = uVar27;
            auVar14._24_4_ = uVar27;
            auVar14._28_4_ = uVar27;
            auVar53 = vpcmpeqd_avx2(auVar11,auVar14);
            uVar40 = 0;
            auVar56 = vpmovsxbd_avx2(ZEXT816(0xfffefdfcfbfaf9));
            auVar10._4_4_ = iVar42;
            auVar10._0_4_ = iVar42;
            auVar10._8_4_ = iVar42;
            auVar10._12_4_ = iVar42;
            auVar10._16_4_ = iVar42;
            auVar10._20_4_ = iVar42;
            auVar10._24_4_ = iVar42;
            auVar10._28_4_ = iVar42;
            auVar14 = auVar10;
            do {
              auVar57 = vpinsrd_avx(ZEXT416((uint)piVar4[(long)(int)(uVar43 * iVar2) +
                                                         (long)*(int *)(ptr[1] + uVar40 * 4)]),
                                    piVar4[(long)(int)(uVar35 * iVar2) +
                                           (long)*(int *)(ptr[1] + uVar40 * 4 + 4)],1);
              auVar57 = vpinsrd_avx(auVar57,piVar4[(long)(int)(uVar31 * iVar2) +
                                                   (long)*(int *)(ptr[1] + uVar40 * 4 + 8)],2);
              auVar57 = vpinsrd_avx(auVar57,piVar4[(long)(int)(uVar25 * iVar2) +
                                                   (long)*(int *)(ptr[1] + uVar40 * 4 + 0xc)],3);
              auVar6 = vpinsrd_avx(ZEXT416((uint)piVar4[(long)(int)(uVar28 * iVar2) +
                                                        (long)*(int *)(*ptr + uVar40 * 4)]),
                                   piVar4[(long)(int)(uVar39 * iVar2) +
                                          (long)*(int *)(*ptr + uVar40 * 4 + 4)],1);
              auVar6 = vpinsrd_avx(auVar6,piVar4[(long)(int)(uVar29 * iVar2) +
                                                 (long)*(int *)(*ptr + uVar40 * 4 + 8)],2);
              auVar6 = vpinsrd_avx(auVar6,piVar4[(long)(int)(local_23c * iVar2) +
                                                 (long)*(int *)(*ptr + uVar40 * 4 + 0xc)],3);
              auVar54._0_16_ = ZEXT116(0) * auVar57 + ZEXT116(1) * auVar6;
              auVar54._16_16_ = ZEXT116(1) * auVar57;
              auVar50 = vpermd_avx2(auVar12,auVar13);
              auVar55 = vpaddd_avx2(auVar58,auVar54);
              iVar1 = ptr_00[uVar40 + 7];
              auVar58._4_4_ = iVar1;
              auVar58._0_4_ = iVar1;
              auVar58._8_4_ = iVar1;
              auVar58._12_4_ = iVar1;
              auVar58._16_4_ = iVar1;
              auVar58._20_4_ = iVar1;
              auVar58._24_4_ = iVar1;
              auVar58._28_4_ = iVar1;
              auVar58 = vpblendd_avx2(auVar50,auVar58,0x80);
              auVar50 = vpermd_avx2(auVar12,auVar14);
              iVar1 = ptr_01[uVar40 + 7];
              auVar59._4_4_ = iVar1;
              auVar59._0_4_ = iVar1;
              auVar59._8_4_ = iVar1;
              auVar59._12_4_ = iVar1;
              auVar59._16_4_ = iVar1;
              auVar59._20_4_ = iVar1;
              auVar59._24_4_ = iVar1;
              auVar59._28_4_ = iVar1;
              auVar14 = vpblendd_avx2(auVar50,auVar59,0x80);
              auVar50 = vpsubd_avx2(auVar58,auVar18);
              auVar14 = vpsubd_avx2(auVar14,auVar47);
              auVar14 = vpmaxsd_avx2(auVar50,auVar14);
              auVar50 = vpsubd_avx2(auVar13,auVar18);
              auVar13 = vpsubd_avx2(auVar10,auVar47);
              auVar54 = vpmaxsd_avx2(auVar50,auVar13);
              auVar50 = vpmaxsd_avx2(auVar54,auVar14);
              auVar55 = vpmaxsd_avx2(auVar55,auVar50);
              auVar10 = vpcmpeqd_avx2(auVar56,auVar9);
              auVar13 = vblendvps_avx(auVar55,local_158,auVar10);
              if (7 < uVar40) {
                auVar55 = vpminsd_avx2(auVar51._0_32_,auVar13);
                auVar51 = ZEXT3264(auVar55);
                auVar55 = vpmaxsd_avx2(auVar49._0_32_,auVar13);
                auVar49 = ZEXT3264(auVar55);
              }
              auVar55 = auVar49._0_32_;
              auVar50 = auVar51._0_32_;
              piVar5 = ((ppVar21->field_4).rowcols)->score_row;
              auVar57 = auVar13._16_16_;
              if (uVar40 < uVar24) {
                uVar3 = vextractps_avx(auVar57,3);
                *(undefined4 *)((long)piVar5 + uVar40 * 4 + local_1d0) = uVar3;
              }
              if (uVar40 - 1 < uVar24 && uVar30 < uVar46) {
                uVar3 = vextractps_avx(auVar57,2);
                *(undefined4 *)((long)piVar5 + uVar40 * 4 + local_1c8) = uVar3;
              }
              if ((uVar32 < uVar46) && ((long)(uVar40 - 2) < (long)uVar24 && 1 < uVar40)) {
                uVar3 = vextractps_avx(auVar57,1);
                *(undefined4 *)((long)piVar5 + uVar40 * 4 + local_1f0) = uVar3;
              }
              if ((uVar36 < uVar46) && ((long)(uVar40 - 3) < (long)uVar24 && 2 < uVar40)) {
                *(int *)((long)piVar5 + uVar40 * 4 + local_200) = auVar13._16_4_;
              }
              if ((uVar37 < uVar46) && ((long)(uVar40 - 4) < (long)uVar24 && 3 < uVar40)) {
                *(int *)((long)piVar5 + uVar40 * 4 + local_1f8) = auVar13._12_4_;
              }
              if ((uVar38 < uVar46) && ((long)(uVar40 - 5) < (long)uVar24 && 4 < uVar40)) {
                *(int *)((long)piVar5 + uVar40 * 4 + local_1e8) = auVar13._8_4_;
              }
              if ((uVar33 < uVar46) && ((long)(uVar40 - 6) < (long)uVar24 && 5 < uVar40)) {
                *(int *)((long)piVar5 + uVar40 * 4 + local_1e0) = auVar13._4_4_;
              }
              if ((uVar34 < uVar46) && ((long)(uVar40 - 7) < (long)uVar24 && 6 < uVar40)) {
                *(int32_t *)((long)piVar5 + uVar40 * 4 + local_1d8) = auVar13._0_4_;
              }
              auVar15._4_4_ = iVar42;
              auVar15._0_4_ = iVar42;
              auVar15._8_4_ = iVar42;
              auVar15._12_4_ = iVar42;
              auVar15._16_4_ = iVar42;
              auVar15._20_4_ = iVar42;
              auVar15._24_4_ = iVar42;
              auVar15._28_4_ = iVar42;
              auVar14 = vblendvps_avx(auVar14,auVar15,auVar10);
              auVar10 = vblendvps_avx(auVar54,auVar15,auVar10);
              ptr_00[uVar40] = auVar13._0_4_;
              ptr_01[uVar40] = auVar14._0_4_;
              auVar17._4_4_ = iVar20;
              auVar17._0_4_ = iVar20;
              auVar17._8_4_ = iVar20;
              auVar17._12_4_ = iVar20;
              auVar17._16_4_ = iVar20;
              auVar17._20_4_ = iVar20;
              auVar17._24_4_ = iVar20;
              auVar17._28_4_ = iVar20;
              auVar54 = vpcmpeqd_avx2(auVar56,auVar17);
              auVar54 = vpand_avx2(auVar53,auVar54);
              auVar54 = vblendvps_avx(auVar52._0_32_,auVar13,auVar54);
              auVar52 = ZEXT3264(auVar54);
              auVar56 = vpsubd_avx2(auVar56,auVar9);
              uVar40 = uVar40 + 1;
            } while (uVar44 != uVar40);
            auVar16._8_4_ = 8;
            auVar16._0_8_ = 0x800000008;
            auVar16._12_4_ = 8;
            auVar16._16_4_ = 8;
            auVar16._20_4_ = 8;
            auVar16._24_4_ = 8;
            auVar16._28_4_ = 8;
            auVar11 = vpaddd_avx2(auVar11,auVar16);
            local_158 = vpsubd_avx2(local_158,auVar48);
            local_1d0 = local_1d0 + lVar22;
            local_1c8 = local_1c8 + lVar22;
            local_1d8 = local_1d8 + lVar22;
            local_1e0 = local_1e0 + lVar22;
            local_1e8 = local_1e8 + lVar22;
            local_1f8 = local_1f8 + lVar22;
            local_200 = local_200 + lVar22;
            local_1f0 = local_1f0 + lVar22;
          } while (uVar45 < uVar46);
        }
        iVar19 = 8;
        iVar26 = iVar42;
        do {
          if (iVar26 < auVar52._28_4_) {
            iVar26 = auVar52._28_4_;
          }
          auVar48 = auVar52._0_32_;
          auVar47 = vperm2i128_avx2(auVar48,auVar48,0x28);
          auVar47 = vpalignr_avx2(auVar48,auVar47,0xc);
          auVar52 = ZEXT3264(auVar47);
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
        auVar48._4_4_ = iVar42;
        auVar48._0_4_ = iVar42;
        auVar48._8_4_ = iVar42;
        auVar48._12_4_ = iVar42;
        auVar48._16_4_ = iVar42;
        auVar48._20_4_ = iVar42;
        auVar48._24_4_ = iVar42;
        auVar48._28_4_ = iVar42;
        auVar47 = vpcmpgtd_avx2(auVar48,auVar50);
        auVar8._4_4_ = iVar41;
        auVar8._0_4_ = iVar41;
        auVar8._8_4_ = iVar41;
        auVar8._12_4_ = iVar41;
        auVar8._16_4_ = iVar41;
        auVar8._20_4_ = iVar41;
        auVar8._24_4_ = iVar41;
        auVar8._28_4_ = iVar41;
        auVar48 = vpcmpgtd_avx2(auVar55,auVar8);
        auVar47 = vpor_avx2(auVar47,auVar48);
        if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar47 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar47 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar47 >> 0x7f,0) != '\0') ||
              (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar47 >> 0xbf,0) != '\0') ||
            (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar47[0x1f] < '\0') {
          *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
          iVar26 = 0;
          iVar20 = 0;
          uVar27 = 0;
        }
        ppVar21->score = iVar26;
        ppVar21->end_query = uVar27;
        ppVar21->end_ref = iVar20;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(local_238);
          return ppVar21;
        }
        return ppVar21;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMax;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi32(NEG_LIMIT);
    vOpen = _mm256_set1_epi32(open);
    vGap  = _mm256_set1_epi32(gap);
    vOne = _mm256_set1_epi32(1);
    vN = _mm256_set1_epi32(N);
    vGapN = _mm256_set1_epi32(gap*N);
    vNegOne = _mm256_set1_epi32(-1);
    vI = _mm256_set_epi32(0,1,2,3,4,5,6,7);
    vJreset = _mm256_set_epi32(0,-1,-2,-3,-4,-5,-6,-7);
    vMax = vNegInf;
    vILimit = _mm256_set1_epi32(s1Len);
    vILimit1 = _mm256_sub_epi32(vILimit, vOne);
    vJLimit = _mm256_set1_epi32(s2Len);
    vJLimit1 = _mm256_sub_epi32(vJLimit, vOne);
    vIBoundary = _mm256_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        vNH = _mm256_srli_si256_rpl(vNH, 4);
        vNH = _mm256_insert_epi32_rpl(vNH, H_pr[-1], 7);
        vWH = _mm256_srli_si256_rpl(vWH, 4);
        vWH = _mm256_insert_epi32_rpl(vWH, -open - i*gap, 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 4);
            vNH = _mm256_insert_epi32_rpl(vNH, H_pr[j], 7);
            vF = _mm256_srli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, F_pr[j], 7);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vNH, vOpen),
                    _mm256_sub_epi32(vF, vGap));
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vWH, vOpen),
                    _mm256_sub_epi32(vE, vGap));
            vMat = _mm256_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm256_add_epi32(vNWH, vMat);
            vWH = _mm256_max_epi32(vNWH, vE);
            vWH = _mm256_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vWH,0);
            F_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m256i cond_valid_I = _mm256_cmpeq_epi32(vI, vILimit1);
                __m256i cond_valid_J = _mm256_cmpeq_epi32(vJ, vJLimit1);
                __m256i cond_all = _mm256_and_si256(cond_valid_I, cond_valid_J);
                vMax = _mm256_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm256_add_epi32(vJ, vOne);
        }
        vI = _mm256_add_epi32(vI, vN);
        vIBoundary = _mm256_sub_epi32(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int32_t value;
        value = (int32_t) _mm256_extract_epi32_rpl(vMax, 7);
        if (value > score) {
            score = value;
        }
        vMax = _mm256_slli_si256_rpl(vMax, 4);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}